

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_bool nk_panel_begin(nk_context *ctx,char *title,nk_panel_type panel_type)

{
  nk_style_item_data *pnVar1;
  byte *pbVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ulong uVar8;
  undefined4 uVar13;
  nk_panel *pnVar14;
  long lVar15;
  undefined8 string;
  nk_handle *f;
  uint uVar16;
  nk_bool nVar17;
  long lVar18;
  nk_style_window *pnVar19;
  nk_color c;
  nk_command_buffer *b;
  nk_context *in;
  uint uVar20;
  ulong uVar21;
  size_t sVar22;
  nk_window *pnVar23;
  nk_panel *pnVar24;
  nk_vec2 nVar25;
  undefined1 auVar29 [12];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar30;
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  nk_vec2 nVar35;
  undefined1 auVar36 [16];
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  nk_rect r;
  nk_rect rect;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect b_00;
  nk_rect rect_00;
  nk_rect r_00;
  nk_flags ws;
  nk_flags local_bc;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  nk_handle *local_80;
  nk_text local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  
  uVar20 = 0;
  if (((ctx != (nk_context *)0x0) && (pnVar23 = ctx->current, pnVar23 != (nk_window *)0x0)) &&
     (pnVar24 = pnVar23->layout, pnVar24 != (nk_panel *)0x0)) {
    local_a8._8_8_ = local_a8._0_8_;
    local_a8._0_8_ = title;
    uVar21 = (ulong)pnVar24 & 3;
    if (uVar21 == 0) {
      memset(pnVar24,0,0x1c0);
    }
    else {
      sVar22 = -uVar21 + 4;
      memset(pnVar24,0,sVar22);
      memset((void *)((long)pnVar24 + sVar22),0,0x1bc);
      memset((void *)((long)pnVar24 + -uVar21 + 0x1c0),0,uVar21);
      pnVar23 = ctx->current;
    }
    uVar20 = pnVar23->flags;
    if ((uVar20 & 0x6000) == 0) {
      local_80 = &((ctx->style).font)->userdata;
      pnVar24 = pnVar23->layout;
      in = (nk_context *)0x0;
      if ((uVar20 >> 10 & 1) == 0) {
        in = ctx;
      }
      local_b8._0_4_ = (ctx->style).window.scrollbar_size.x;
      local_98._0_4_ = (ctx->style).window.scrollbar_size.y;
      nVar25 = nk_panel_get_padding(&ctx->style,panel_type);
      fVar43 = nVar25.y;
      string = local_a8._0_8_;
      if ((uVar20 & 0x1002) == 2) {
        uVar3 = (pnVar23->bounds).x;
        uVar9 = (pnVar23->bounds).y;
        fVar42 = fVar43;
        if (((char *)local_a8._0_8_ != (char *)0x0) && ((uVar20 & 0x58) != 0)) {
          fVar42 = (ctx->style).window.header.padding.y;
          fVar30 = (ctx->style).window.header.label_padding.y;
          fVar42 = fVar30 + fVar30 + fVar42 + fVar42 + *(float *)(local_80 + 1);
        }
        fVar30 = (in->input).mouse.buttons[0].clicked_pos.x;
        if (((float)uVar3 <= fVar30) && (fVar30 < (float)uVar3 + (pnVar23->bounds).w)) {
          fVar44 = (in->input).mouse.buttons[0].clicked_pos.y;
          if (((float)uVar9 <= fVar44) &&
             (((fVar44 < fVar42 + (float)uVar9 && ((in->input).mouse.buttons[0].down == 1)) &&
              ((in->input).mouse.buttons[0].clicked == 0)))) {
            nVar35 = (in->input).mouse.delta;
            fVar42 = nVar35.x;
            fVar41 = nVar35.y;
            (pnVar23->bounds).x = (float)uVar3 + fVar42;
            (pnVar23->bounds).y = (float)uVar9 + fVar41;
            nVar35.x = fVar30 + fVar42;
            nVar35.y = fVar44 + fVar41;
            (in->input).mouse.buttons[0].clicked_pos = nVar35;
            (ctx->style).cursor_active = (ctx->style).cursors[2];
          }
        }
      }
      pnVar24->type = panel_type;
      pnVar24->flags = uVar20;
      fVar42 = (pnVar23->bounds).y;
      fVar30 = (pnVar23->bounds).w;
      fVar44 = (pnVar23->bounds).h;
      (pnVar24->bounds).x = (pnVar23->bounds).x;
      (pnVar24->bounds).y = fVar42;
      (pnVar24->bounds).w = fVar30;
      (pnVar24->bounds).h = fVar44;
      fVar42 = nVar25.x;
      fVar30 = (pnVar24->bounds).x + fVar42;
      (pnVar24->bounds).x = fVar30;
      (pnVar24->bounds).w = (pnVar24->bounds).w - (fVar42 + fVar42);
      if ((pnVar23->flags & 1) == 0) {
        pnVar24->border = 0.0;
        uVar31 = CONCAT44((pnVar24->bounds).y,fVar30);
      }
      else {
        lVar18 = 0x1e68;
        if ((int)panel_type < 0x10) {
          if (panel_type == NK_PANEL_GROUP) {
            lVar18 = 0x1e78;
          }
          else if (panel_type == NK_PANEL_POPUP) {
            lVar18 = 0x1e80;
          }
        }
        else if (panel_type == NK_PANEL_CONTEXTUAL) {
          lVar18 = 0x1e70;
        }
        else if (panel_type == NK_PANEL_COMBO) {
          lVar18 = 0x1e6c;
        }
        else if (panel_type == NK_PANEL_MENU) {
          lVar18 = 0x1e74;
        }
        fVar42 = *(float *)((long)&(ctx->input).keyboard.keys[0].down + lVar18);
        pnVar24->border = fVar42;
        uVar4 = (pnVar24->bounds).x;
        uVar10 = (pnVar24->bounds).y;
        uVar5 = (pnVar24->bounds).w;
        uVar11 = (pnVar24->bounds).h;
        auVar33._4_4_ = uVar11;
        auVar33._0_4_ = uVar5;
        uVar31 = CONCAT44(fVar42 + (float)uVar10,fVar42 + (float)uVar4);
        fVar30 = fVar42 + fVar42;
        auVar37._4_4_ = fVar30;
        auVar37._0_4_ = fVar30;
        auVar37._8_4_ = fVar30;
        auVar37._12_4_ = fVar30;
        auVar33._8_8_ = 0;
        auVar33 = maxps(auVar37,auVar33);
        (pnVar24->bounds).x = fVar42 + (float)uVar4;
        (pnVar24->bounds).y = fVar42 + (float)uVar10;
        (pnVar24->bounds).w = auVar33._0_4_ - fVar30;
        (pnVar24->bounds).h = auVar33._4_4_ - fVar30;
      }
      pnVar24->at_x = (float)(int)uVar31;
      pnVar24->at_y = (float)(int)((ulong)uVar31 >> 0x20);
      pnVar24->max_x = 0.0;
      pnVar24->footer_height = 0.0;
      pnVar24->header_height = 0.0;
      if ((ctx->current != (nk_window *)0x0) &&
         (pnVar14 = ctx->current->layout, pnVar14 != (nk_panel *)0x0)) {
        fVar42 = (ctx->style).text.padding.y;
        fVar30 = (ctx->style).window.min_row_height_padding;
        (pnVar14->row).min_height = fVar30 + fVar30 + fVar42 + fVar42 + ((ctx->style).font)->height;
      }
      (pnVar24->row).index = 0;
      (pnVar24->row).columns = 0;
      (pnVar24->row).ratio = (float *)0x0;
      (pnVar24->row).item_width = 0.0;
      (pnVar24->row).tree_depth = 0;
      (pnVar24->row).height = fVar43;
      pnVar24->has_scrolling = 1;
      uVar16 = pnVar23->flags;
      if ((uVar16 & 0x20) == 0) {
        (pnVar24->bounds).w = (pnVar24->bounds).w - (float)local_b8._0_4_;
      }
      if ((panel_type & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL)) ==
          NK_PANEL_NONE) {
        fVar43 = 0.0;
        if ((uVar16 & 0x24) != 0x20) {
          fVar43 = (float)local_98._0_4_;
        }
        pnVar24->footer_height = fVar43;
        (pnVar24->bounds).h = (pnVar24->bounds).h - fVar43;
        uVar16 = pnVar23->flags;
      }
      b = &pnVar23->buffer;
      if ((((char *)local_a8._0_8_ != (char *)0x0) && ((uVar16 & 0x58) != 0)) &&
         ((uVar16 & 0x2000) == 0)) {
        local_b8._0_4_ = (pnVar23->bounds).x;
        local_b8._4_4_ = (pnVar23->bounds).y;
        fVar43 = (pnVar23->bounds).w;
        fVar42 = (ctx->style).window.header.padding.y;
        fVar30 = (ctx->style).window.header.label_padding.y;
        fVar42 = fVar30 + fVar30 + fVar42 + fVar42 + *(float *)(local_80 + 1);
        pnVar24->header_height = fVar42;
        (pnVar24->bounds).y = (pnVar24->bounds).y + fVar42;
        (pnVar24->bounds).h = (pnVar24->bounds).h - fVar42;
        pnVar24->at_y = (float)((ulong)uVar31 >> 0x20) + fVar42;
        if (ctx->active == pnVar23) {
          pnVar19 = (nk_style_window *)&(ctx->style).window.header.active;
          local_78.text = (ctx->style).window.header.label_active;
        }
        else {
          fVar30 = (ctx->input).mouse.pos.x;
          if ((((fVar30 < (float)local_b8._0_4_) || ((float)local_b8._0_4_ + fVar43 <= fVar30)) ||
              (fVar30 = (ctx->input).mouse.pos.y, fVar30 < (float)local_b8._4_4_)) ||
             ((float)local_b8._4_4_ + fVar42 <= fVar30)) {
            pnVar19 = &(ctx->style).window;
            local_78.text = (ctx->style).window.header.label_normal;
          }
          else {
            pnVar19 = (nk_style_window *)&(ctx->style).window.header.hover;
            local_78.text = (ctx->style).window.header.label_hover;
          }
        }
        local_48._4_4_ = local_b8._4_4_;
        local_48._0_4_ = local_b8._4_4_;
        fStack_40 = (float)local_b8._4_4_;
        fStack_3c = (float)local_b8._4_4_;
        fVar42 = fVar42 + 1.0;
        local_58 = ZEXT416((uint)fVar42);
        local_68 = ZEXT416((uint)fVar43);
        r._8_8_ = CONCAT44(fVar42,fVar43);
        pnVar1 = &(pnVar19->header).normal.data;
        local_a8._0_8_ = b;
        _uStack_b0 = 0;
        local_98._8_8_ = 0;
        local_98._0_8_ = r._8_8_;
        if ((pnVar19->header).normal.type == NK_STYLE_ITEM_IMAGE) {
          r.x = (float)local_b8._0_4_;
          r.y = (float)local_b8._4_4_;
          nk_draw_image(b,r,&pnVar1->image,(nk_color)0xffffffff);
          c.r = '\0';
          c.g = '\0';
          c.b = '\0';
          c.a = '\0';
        }
        else {
          c = pnVar1->color;
          rect.w = fVar43;
          rect.h = fVar42;
          rect.x = (float)local_b8._0_4_;
          rect.y = (float)local_b8._4_4_;
          nk_fill_rect(b,rect,0.0,c);
        }
        fVar43 = (ctx->style).window.header.padding.y;
        auVar38._0_4_ = (float)local_48._0_4_ + fVar43;
        auVar38._4_4_ = auVar38._0_4_;
        auVar38._8_4_ = auVar38._0_4_;
        auVar38._12_4_ = auVar38._0_4_;
        fVar43 = (float)local_58._0_4_ - (fVar43 + fVar43);
        auVar33 = CONCAT412(fVar43,CONCAT48(fVar43,CONCAT44(fVar43,fVar43)));
        uVar20 = pnVar23->flags;
        uVar31 = local_a8._0_8_;
        local_78.background = c;
        if ((uVar20 & 8) != 0) {
          local_bc = 0;
          local_58._0_4_ = fVar43;
          register0x000012c4 = auVar38._4_12_;
          if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
            fVar42 = (ctx->style).window.header.padding.x;
            fVar30 = ((float)local_b8._0_4_ + (float)local_68._0_4_) - (fVar43 + fVar42);
            local_98._0_4_ =
                 (float)local_68._0_4_ - ((ctx->style).window.header.spacing.x + fVar43 + fVar42);
          }
          else {
            fVar42 = (ctx->style).window.header.padding.x;
            fVar30 = (float)local_b8._0_4_ + fVar42;
            local_b8._0_4_ =
                 (float)local_b8._0_4_ + (ctx->style).window.header.spacing.x + fVar43 + fVar42;
          }
          local_48._0_4_ = fVar30;
          bounds.y = auVar38._0_4_;
          bounds.x = fVar30;
          bounds.w = fVar43;
          bounds.h = fVar43;
          local_68 = auVar33;
          nVar17 = nk_do_button_symbol(&local_bc,(nk_command_buffer *)local_a8._0_8_,bounds,
                                       (ctx->style).window.header.close_symbol,NK_BUTTON_DEFAULT,
                                       &(ctx->style).window.header.close_button,&in->input,
                                       (ctx->style).font);
          uVar20 = pnVar23->flags;
          if ((uVar20 >> 0xc & 1) == 0 && nVar17 != 0) {
            pnVar24->flags = pnVar24->flags & 0xffff5fff | 0x2000;
          }
          auVar33 = local_68;
          auVar38 = _local_48;
          fVar43 = (float)local_58._0_4_;
        }
        if ((uVar20 & 0x10) != 0) {
          local_bc = 0;
          auVar39._4_12_ = auVar38._4_12_;
          if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
            auVar29 = local_98._4_12_;
            fVar42 = (local_98._0_4_ + (float)local_b8._0_4_) - fVar43;
            if ((uVar20 & 8) == 0) {
              fVar30 = (ctx->style).window.header.padding.x;
              fVar42 = fVar42 - fVar30;
              auVar26._0_8_ = local_98._4_8_ << 0x20;
              auVar26._8_4_ = local_98._8_4_;
              auVar26._12_4_ = local_98._12_4_;
              local_98._0_4_ = local_98._0_4_ - fVar30;
              local_98._4_12_ = auVar29;
              auVar29 = auVar26._4_12_;
            }
            else {
              auVar27._0_8_ = local_98._4_8_ << 0x20;
              auVar27._8_4_ = local_98._8_4_;
              auVar27._12_4_ = local_98._12_4_;
              auVar29 = auVar27._4_12_;
            }
            auVar39._0_4_ = fVar42;
            fVar42 = local_98._0_4_;
            local_98._4_12_ = auVar29;
            local_98._0_4_ = fVar42 - (fVar43 + (ctx->style).window.header.spacing.x);
          }
          else {
            auVar39._4_4_ = auVar38._4_4_;
            auVar39._0_4_ = local_b8._0_4_;
            auVar39._8_4_ = uStack_b0;
            auVar39._12_4_ = uStack_ac;
            local_b8._0_4_ =
                 (float)local_b8._0_4_ +
                 fVar43 + (ctx->style).window.header.spacing.x +
                 (ctx->style).window.header.padding.x;
          }
          bounds_00._0_8_ = auVar39._0_8_;
          bounds_00._8_8_ = auVar33._0_8_;
          nVar17 = nk_do_button_symbol(&local_bc,(nk_command_buffer *)uVar31,bounds_00,
                                       (&(ctx->style).window.header.minimize_symbol)
                                       [(ushort)((ushort)pnVar24->flags >> 0xf)],NK_BUTTON_DEFAULT,
                                       &(ctx->style).window.header.minimize_button,&in->input,
                                       (ctx->style).font);
          if ((nVar17 != 0) && ((pnVar23->flags & 0x1000) == 0)) {
            pbVar2 = (byte *)((long)&pnVar24->flags + 1);
            *pbVar2 = *pbVar2 ^ 0x80;
          }
        }
        f = local_80;
        if (*(char *)string == '\0') {
          lVar18 = 0;
        }
        else {
          lVar18 = 0;
          do {
            lVar15 = lVar18 + 1;
            lVar18 = lVar18 + 1;
          } while (*(char *)(string + lVar15) != '\0');
        }
        fVar42 = (*(code *)local_80[2])(*local_80,(float)local_80[1].id,(char *)string,(int)lVar18);
        local_78.padding.x = 0.0;
        local_78.padding.y = 0.0;
        nVar25 = (ctx->style).window.header.label_padding;
        fVar44 = (float)local_b8._0_4_ + (ctx->style).window.header.padding.x + nVar25.x;
        fVar30 = nVar25.y;
        fVar43 = (ctx->style).window.header.spacing.x;
        fVar42 = fVar43 + fVar43 + fVar42;
        fVar43 = ((float)local_98._0_4_ + (float)local_b8._0_4_) - fVar44;
        if (fVar43 <= fVar42) {
          fVar42 = fVar43;
        }
        fVar43 = 0.0;
        if (0.0 <= fVar42) {
          fVar43 = fVar42;
        }
        b_00.h = fVar30 + fVar30 + *(float *)(f + 1);
        b_00.w = fVar43;
        b = (nk_command_buffer *)local_a8._0_8_;
        b_00.y = (float)local_b8._4_4_ + fVar30;
        b_00.x = fVar44;
        nk_widget_text((nk_command_buffer *)local_a8._0_8_,b_00,(char *)string,(int)lVar18,&local_78
                       ,0x11,(nk_user_font *)f);
        uVar20 = pnVar24->flags;
      }
      if ((uVar20 & 0x8800) == 0) {
        fVar30 = (pnVar23->bounds).y + pnVar24->header_height;
        fVar43 = (pnVar23->bounds).x;
        fVar42 = (pnVar23->bounds).w;
        fVar44 = (pnVar23->bounds).h - pnVar24->header_height;
        pnVar1 = &(ctx->style).window.fixed_background.data;
        if ((ctx->style).window.fixed_background.type == NK_STYLE_ITEM_IMAGE) {
          nk_draw_image(b,(nk_rect)CONCAT88(CONCAT44(fVar44,fVar42),CONCAT44(fVar30,fVar43)),
                        &pnVar1->image,(nk_color)0xffffffff);
        }
        else {
          rect_00.w = fVar42;
          rect_00.h = fVar44;
          rect_00.x = fVar43;
          rect_00.y = fVar30;
          nk_fill_rect(b,rect_00,0.0,pnVar1->color);
        }
      }
      fVar43 = (pnVar24->bounds).y;
      fVar42 = (pnVar24->bounds).w;
      fVar30 = (pnVar24->bounds).h;
      (pnVar24->clip).x = (pnVar24->bounds).x;
      (pnVar24->clip).y = fVar43;
      (pnVar24->clip).w = fVar42;
      (pnVar24->clip).h = fVar30;
      uVar21._0_4_ = (pnVar24->clip).x;
      uVar21._4_4_ = (pnVar24->clip).y;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar21;
      uVar6 = (pnVar24->clip).w;
      uVar12 = (pnVar24->clip).h;
      auVar36._0_4_ = (float)uVar6 + (float)(undefined4)uVar21;
      auVar36._4_4_ = (float)uVar12 + (float)uVar21._4_4_;
      auVar36._8_8_ = 0;
      uVar8._0_4_ = (pnVar23->buffer).clip.x;
      uVar8._4_4_ = (pnVar23->buffer).clip.y;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar8;
      uVar7 = (pnVar23->buffer).clip.w;
      uVar13 = (pnVar23->buffer).clip.h;
      local_a8 = maxps(auVar28,auVar40);
      auVar32._0_4_ = (float)uVar7 + (float)(undefined4)uVar8;
      auVar32._4_4_ = (float)uVar13 + (float)uVar8._4_4_;
      auVar32._8_8_ = 0;
      auVar33 = minps(auVar32,auVar36);
      auVar34._0_4_ = auVar33._0_4_ - local_a8._0_4_;
      auVar34._4_4_ = auVar33._4_4_ - local_a8._4_4_;
      auVar34._8_4_ = auVar33._8_4_ - local_a8._8_4_;
      auVar34._12_4_ = auVar33._12_4_ - local_a8._12_4_;
      _local_b8 = maxps(auVar34,ZEXT816(0));
      r_00._0_8_ = local_a8._0_8_;
      r_00._8_8_ = local_b8;
      nk_push_scissor(b,r_00);
      (pnVar24->clip).x = (float)local_a8._0_4_;
      (pnVar24->clip).y = (float)local_a8._4_4_;
      (pnVar24->clip).w = (float)local_b8._0_4_;
      (pnVar24->clip).h = (float)local_b8._4_4_;
      uVar20 = (uint)(-1 < (short)pnVar24->flags);
      if ((pnVar24->flags >> 0xd & 1) != 0) {
        uVar20 = 0;
      }
    }
    else {
      pnVar24 = pnVar23->layout;
      uVar21 = (ulong)pnVar24 & 3;
      if (uVar21 == 0) {
        memset(pnVar24,0,0x1c0);
      }
      else {
        sVar22 = -uVar21 + 4;
        memset(pnVar24,0,sVar22);
        memset((void *)((long)pnVar24 + sVar22),0,0x1bc);
        memset((void *)((long)pnVar24 + -uVar21 + 0x1c0),0,uVar21);
        pnVar24 = ctx->current->layout;
      }
      pnVar24->type = panel_type;
      uVar20 = 0;
    }
  }
  return uVar20;
}

Assistant:

NK_LIB nk_bool
nk_panel_begin(struct nk_context *ctx, const char *title, enum nk_panel_type panel_type)
{
struct nk_input *in;
struct nk_window *win;
struct nk_panel *layout;
struct nk_command_buffer *out;
const struct nk_style *style;
const struct nk_user_font *font;

struct nk_vec2 scrollbar_size;
struct nk_vec2 panel_padding;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout) return 0;
nk_zero(ctx->current->layout, sizeof(*ctx->current->layout));
if ((ctx->current->flags & NK_WINDOW_HIDDEN) || (ctx->current->flags & NK_WINDOW_CLOSED)) {
nk_zero(ctx->current->layout, sizeof(struct nk_panel));
ctx->current->layout->type = panel_type;
return 0;
}
/* pull state into local stack */
style = &ctx->style;
font = style->font;
win = ctx->current;
layout = win->layout;
out = &win->buffer;
in = (win->flags & NK_WINDOW_NO_INPUT) ? 0: &ctx->input;
#ifdef NK_INCLUDE_COMMAND_USERDATA
win->buffer.userdata = ctx->userdata;
#endif
/* pull style configuration into local stack */
scrollbar_size = style->window.scrollbar_size;
panel_padding = nk_panel_get_padding(style, panel_type);

/* window movement */
if ((win->flags & NK_WINDOW_MOVABLE) && !(win->flags & NK_WINDOW_ROM)) {
int left_mouse_down;
int left_mouse_clicked;
int left_mouse_click_in_cursor;

/* calculate draggable window space */
struct nk_rect header;
header.x = win->bounds.x;
header.y = win->bounds.y;
header.w = win->bounds.w;
if (nk_panel_has_header(win->flags, title)) {
header.h = font->height + 2.0f * style->window.header.padding.y;
header.h += 2.0f * style->window.header.label_padding.y;
} else header.h = panel_padding.y;

/* window movement by dragging */
left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
left_mouse_clicked = (int)in->mouse.buttons[NK_BUTTON_LEFT].clicked;
left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
NK_BUTTON_LEFT, header, nk_true);
if (left_mouse_down && left_mouse_click_in_cursor && !left_mouse_clicked) {
win->bounds.x = win->bounds.x + in->mouse.delta.x;
win->bounds.y = win->bounds.y + in->mouse.delta.y;
in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x += in->mouse.delta.x;
in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y += in->mouse.delta.y;
ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_MOVE];
}
}

/* setup panel */
layout->type = panel_type;
layout->flags = win->flags;
layout->bounds = win->bounds;
layout->bounds.x += panel_padding.x;
layout->bounds.w -= 2*panel_padding.x;
if (win->flags & NK_WINDOW_BORDER) {
layout->border = nk_panel_get_border(style, win->flags, panel_type);
layout->bounds = nk_shrink_rect(layout->bounds, layout->border);
} else layout->border = 0;
layout->at_y = layout->bounds.y;
layout->at_x = layout->bounds.x;
layout->max_x = 0;
layout->header_height = 0;
layout->footer_height = 0;
nk_layout_reset_min_row_height(ctx);
layout->row.index = 0;
layout->row.columns = 0;
layout->row.ratio = 0;
layout->row.item_width = 0;
layout->row.tree_depth = 0;
layout->row.height = panel_padding.y;
layout->has_scrolling = nk_true;
if (!(win->flags & NK_WINDOW_NO_SCROLLBAR))
layout->bounds.w -= scrollbar_size.x;
if (!nk_panel_is_nonblock(panel_type)) {
layout->footer_height = 0;
if (!(win->flags & NK_WINDOW_NO_SCROLLBAR) || win->flags & NK_WINDOW_SCALABLE)
layout->footer_height = scrollbar_size.y;
layout->bounds.h -= layout->footer_height;
}

/* panel header */
if (nk_panel_has_header(win->flags, title))
{
struct nk_text text;
struct nk_rect header;
const struct nk_style_item *background = 0;

/* calculate header bounds */
header.x = win->bounds.x;
header.y = win->bounds.y;
header.w = win->bounds.w;
header.h = font->height + 2.0f * style->window.header.padding.y;
header.h += (2.0f * style->window.header.label_padding.y);

/* shrink panel by header */
layout->header_height = header.h;
layout->bounds.y += header.h;
layout->bounds.h -= header.h;
layout->at_y += header.h;

/* select correct header background and text color */
if (ctx->active == win) {
background = &style->window.header.active;
text.text = style->window.header.label_active;
} else if (nk_input_is_mouse_hovering_rect(&ctx->input, header)) {
background = &style->window.header.hover;
text.text = style->window.header.label_hover;
} else {
background = &style->window.header.normal;
text.text = style->window.header.label_normal;
}

/* draw header background */
header.h += 1.0f;
if (background->type == NK_STYLE_ITEM_IMAGE) {
text.background = nk_rgba(0,0,0,0);
nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
} else {
text.background = background->data.color;
nk_fill_rect(out, header, 0, background->data.color);
}

/* window close button */
{struct nk_rect button;
button.y = header.y + style->window.header.padding.y;
button.h = header.h - 2 * style->window.header.padding.y;
button.w = button.h;
if (win->flags & NK_WINDOW_CLOSABLE) {
nk_flags ws = 0;
if (style->window.header.align == NK_HEADER_RIGHT) {
button.x = (header.w + header.x) - (button.w + style->window.header.padding.x);
header.w -= button.w + style->window.header.spacing.x + style->window.header.padding.x;
} else {
button.x = header.x + style->window.header.padding.x;
header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
}

if (nk_do_button_symbol(&ws, &win->buffer, button,
style->window.header.close_symbol, NK_BUTTON_DEFAULT,
&style->window.header.close_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
{
layout->flags |= NK_WINDOW_HIDDEN;
layout->flags &= (nk_flags)~NK_WINDOW_MINIMIZED;
}
}

/* window minimize button */
if (win->flags & NK_WINDOW_MINIMIZABLE) {
nk_flags ws = 0;
if (style->window.header.align == NK_HEADER_RIGHT) {
button.x = (header.w + header.x) - button.w;
if (!(win->flags & NK_WINDOW_CLOSABLE)) {
button.x -= style->window.header.padding.x;
header.w -= style->window.header.padding.x;
}
header.w -= button.w + style->window.header.spacing.x;
} else {
button.x = header.x;
header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
}
if (nk_do_button_symbol(&ws, &win->buffer, button, (layout->flags & NK_WINDOW_MINIMIZED)?
style->window.header.maximize_symbol: style->window.header.minimize_symbol,
NK_BUTTON_DEFAULT, &style->window.header.minimize_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
layout->flags = (layout->flags & NK_WINDOW_MINIMIZED) ?
layout->flags & (nk_flags)~NK_WINDOW_MINIMIZED:
layout->flags | NK_WINDOW_MINIMIZED;
}}

{/* window header title */
int text_len = nk_strlen(title);
struct nk_rect label = {0,0,0,0};
float t = font->width(font->userdata, font->height, title, text_len);
text.padding = nk_vec2(0,0);

label.x = header.x + style->window.header.padding.x;
label.x += style->window.header.label_padding.x;
label.y = header.y + style->window.header.label_padding.y;
label.h = font->height + 2 * style->window.header.label_padding.y;
label.w = t + 2 * style->window.header.spacing.x;
label.w = NK_CLAMP(0, label.w, header.x + header.w - label.x);
nk_widget_text(out, label,(const char*)title, text_len, &text, NK_TEXT_LEFT, font);}
}

/* draw window background */
if (!(layout->flags & NK_WINDOW_MINIMIZED) && !(layout->flags & NK_WINDOW_DYNAMIC)) {
struct nk_rect body;
body.x = win->bounds.x;
body.w = win->bounds.w;
body.y = (win->bounds.y + layout->header_height);
body.h = (win->bounds.h - layout->header_height);
if (style->window.fixed_background.type == NK_STYLE_ITEM_IMAGE)
nk_draw_image(out, body, &style->window.fixed_background.data.image, nk_white);
else nk_fill_rect(out, body, 0, style->window.fixed_background.data.color);
}

/* set clipping rectangle */
{struct nk_rect clip;
layout->clip = layout->bounds;
nk_unify(&clip, &win->buffer.clip, layout->clip.x, layout->clip.y,
layout->clip.x + layout->clip.w, layout->clip.y + layout->clip.h);
nk_push_scissor(out, clip);
layout->clip = clip;}
return !(layout->flags & NK_WINDOW_HIDDEN) && !(layout->flags & NK_WINDOW_MINIMIZED);
}